

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int ReadResponseLineAndHeaders
              (SOCKINFO *info,http_parser_t *parser,int *timeout_secs,int *http_error_code)

{
  bool bVar1;
  int iVar2;
  int ret_code;
  int done;
  char buf [2048];
  int num_read;
  parse_status_t status;
  int *http_error_code_local;
  int *timeout_secs_local;
  http_parser_t *parser_local;
  SOCKINFO *info_local;
  
  buf._2044_4_ = parser_parse_responseline(parser);
  if (buf._2044_4_ == PARSE_INCOMPLETE) {
    bVar1 = false;
  }
  else {
    if (buf._2044_4_ != PARSE_OK) {
      return buf._2044_4_;
    }
    bVar1 = true;
  }
  while( true ) {
    if (bVar1) {
      buf._2044_4_ = parser_parse_headers(parser);
      if ((buf._2044_4_ == PARSE_OK) && (parser->position == POS_ENTITY)) {
        bVar1 = true;
      }
      else {
        if (buf._2044_4_ != PARSE_INCOMPLETE) {
          return buf._2044_4_;
        }
        bVar1 = false;
      }
      while( true ) {
        if (bVar1) {
          return 4;
        }
        buf._2040_4_ = sock_read(info,(char *)&ret_code,0x800,timeout_secs);
        if ((int)buf._2040_4_ < 1) break;
        iVar2 = membuffer_append(&(parser->msg).msg,&ret_code,(long)(int)buf._2040_4_);
        if (iVar2 != 0) {
          parser->http_error_code = 500;
          return 3;
        }
        buf._2044_4_ = parser_parse_headers(parser);
        if ((buf._2044_4_ == PARSE_OK) && (parser->position == POS_ENTITY)) {
          bVar1 = true;
        }
        else {
          if (buf._2044_4_ != PARSE_INCOMPLETE) {
            return buf._2044_4_;
          }
          bVar1 = false;
        }
      }
      if (buf._2040_4_ == 0) {
        *http_error_code = 400;
        return -0x77;
      }
      *http_error_code = parser->http_error_code;
      return buf._2040_4_;
    }
    buf._2040_4_ = sock_read(info,(char *)&ret_code,0x800,timeout_secs);
    if ((int)buf._2040_4_ < 1) {
      if (buf._2040_4_ == 0) {
        *http_error_code = 400;
        return -0x77;
      }
      *http_error_code = parser->http_error_code;
      return buf._2040_4_;
    }
    iVar2 = membuffer_append(&(parser->msg).msg,&ret_code,(long)(int)buf._2040_4_);
    if (iVar2 != 0) break;
    buf._2044_4_ = parser_parse_responseline(parser);
    if (buf._2044_4_ == PARSE_INCOMPLETE) {
      bVar1 = false;
    }
    else {
      if (buf._2044_4_ != PARSE_OK) {
        return buf._2044_4_;
      }
      bVar1 = true;
    }
  }
  parser->http_error_code = 500;
  return 3;
}

Assistant:

static int ReadResponseLineAndHeaders(
	/*! Socket information object. */
	SOCKINFO *info,
	/*! HTTP Parser object. */
	http_parser_t *parser,
	/*! Time out value. */
	int *timeout_secs,
	/*! HTTP errror code returned. */
	int *http_error_code)
{
	parse_status_t status;
	int num_read;
	char buf[2 * 1024];
	int done = 0;
	int ret_code = 0;

	/*read response line */
	status = parser_parse_responseline(parser);
	switch (status) {
	case PARSE_OK:
		done = 1;
		break;
	case PARSE_INCOMPLETE:
		done = 0;
		break;
	default:
		/*error */
		return status;
	}
	while (!done) {
		num_read = sock_read(info, buf, sizeof(buf), timeout_secs);
		if (num_read > 0) {
			/* append data to buffer */
			ret_code = membuffer_append(
				&parser->msg.msg, buf, (size_t)num_read);
			if (ret_code != 0) {
				/* set failure status */
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
			status = parser_parse_responseline(parser);
			switch (status) {
			case PARSE_OK:
				done = 1;
				break;
			case PARSE_INCOMPLETE:
				done = 0;
				break;
			default:
				/*error */
				return status;
			}
		} else if (num_read == 0) {
			/* partial msg */
			*http_error_code = HTTP_BAD_REQUEST; /* or response */
			return UPNP_E_BAD_HTTPMSG;
		} else {
			*http_error_code = parser->http_error_code;
			return num_read;
		}
	}
	status = parser_parse_headers(parser);
	if ((status == (parse_status_t)PARSE_OK) &&
		(parser->position == (parser_pos_t)POS_ENTITY))
		done = 1;
	else if (status == (parse_status_t)PARSE_INCOMPLETE)
		done = 0;
	else
		/*error */
		return status;
	/*read headers */
	while (!done) {
		num_read = sock_read(info, buf, sizeof(buf), timeout_secs);
		if (num_read > 0) {
			/* append data to buffer */
			ret_code = membuffer_append(
				&parser->msg.msg, buf, (size_t)num_read);
			if (ret_code != 0) {
				/* set failure status */
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
			status = parser_parse_headers(parser);
			if (status == (parse_status_t)PARSE_OK &&
				parser->position == (parser_pos_t)POS_ENTITY)
				done = 1;
			else if (status == (parse_status_t)PARSE_INCOMPLETE)
				done = 0;
			else
				/*error */
				return status;
		} else if (num_read == 0) {
			/* partial msg */
			*http_error_code = HTTP_BAD_REQUEST; /* or response */
			return UPNP_E_BAD_HTTPMSG;
		} else {
			*http_error_code = parser->http_error_code;
			return num_read;
		}
	}

	return PARSE_OK;
}